

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

FileDescriptorProto * __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest::ParseFile
          (FileDescriptorProto *__return_storage_ptr__,ValidationErrorTest *this,
          string_view file_name,string_view file_text)

{
  bool bVar1;
  int iVar2;
  LogMessage *this_00;
  Nonnull<const_char_*> failure_msg;
  Arena *arena;
  string_view str;
  SimpleErrorCollector error_collector;
  Parser parser;
  ArrayInputStream input_stream;
  Tokenizer tokenizer;
  LogMessage local_1e0;
  ErrorCollector local_1d0;
  string local_1c8;
  LogMessageFatal local_1a8;
  Parser local_198;
  ArrayInputStream local_110;
  Tokenizer local_f0;
  
  io::ArrayInputStream::ArrayInputStream(&local_110,file_text._M_str,(int)file_text._M_len,-1);
  local_1d0._vptr_ErrorCollector = (_func_int **)&PTR__SimpleErrorCollector_018e00a8;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  io::Tokenizer::Tokenizer(&local_f0,&local_110.super_ZeroCopyInputStream,&local_1d0);
  compiler::Parser::Parser(&local_198);
  local_198.error_collector_ = &local_1d0;
  FileDescriptorProto::FileDescriptorProto(__return_storage_ptr__,(Arena *)0x0);
  bVar1 = compiler::Parser::Parse(&local_198,&local_f0,__return_storage_ptr__);
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x11d8,"parser.Parse(&tokenizer, &proto)");
    this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_1e0,&local_1c8);
    str._M_str = "\n";
    str._M_len = 1;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,str);
    absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,file_text);
    if (!bVar1) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_1e0);
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_1c8);
  if (iVar2 == 0) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::log_internal::
                  MakeCheckOpString<char_const*,std::__cxx11::string_const&>
                            (anon_var_dwarf_a12c75 + 5,&local_1c8,
                             "\"\" == error_collector.last_error()");
  }
  if (failure_msg == (Nonnull<const_char_*>)0x0) {
    *(byte *)&__return_storage_ptr__->field_0 = *(byte *)&__return_storage_ptr__->field_0 | 1;
    arena = (Arena *)(__return_storage_ptr__->super_Message).super_MessageLite._internal_metadata_.
                     ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set
              (&(__return_storage_ptr__->field_0)._impl_.name_,file_name,arena);
    compiler::Parser::~Parser(&local_198);
    io::Tokenizer::~Tokenizer(&local_f0);
    local_1d0._vptr_ErrorCollector = (_func_int **)&PTR__SimpleErrorCollector_018e00a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                               local_1c8.field_2._M_local_buf[0]) + 1);
    }
    io::ErrorCollector::~ErrorCollector(&local_1d0);
    return __return_storage_ptr__;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
             ,0x11db,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_1a8);
}

Assistant:

FileDescriptorProto ParseFile(absl::string_view file_name,
                                absl::string_view file_text) {
    io::ArrayInputStream input_stream(file_text.data(), file_text.size());
    SimpleErrorCollector error_collector;
    io::Tokenizer tokenizer(&input_stream, &error_collector);
    compiler::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    FileDescriptorProto proto;
    ABSL_CHECK(parser.Parse(&tokenizer, &proto))
        << error_collector.last_error() << "\n"
        << file_text;
    ABSL_CHECK_EQ("", error_collector.last_error());
    proto.set_name(file_name);
    return proto;
  }